

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_55e35::lower_shared_reference_visitor::visit_enter
          (lower_shared_reference_visitor *this,ir_assignment *ir)

{
  ir_visitor_status iVar1;
  ir_assignment *ir_local;
  lower_shared_reference_visitor *this_local;
  
  handle_assignment(this,ir);
  iVar1 = ir_rvalue_base_visitor::rvalue_visit((ir_rvalue_base_visitor *)this,ir);
  return iVar1;
}

Assistant:

ir_visitor_status
lower_shared_reference_visitor::visit_enter(ir_assignment *ir)
{
   handle_assignment(ir);
   return rvalue_visit(ir);
}